

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dispatcher.cpp
# Opt level: O0

void __thiscall
cppnet::Dispatcher::Connect(std::__cxx11::string_const&,unsigned_short)::$_0::__0
          (__0 *this,anon_class_48_3_02cd77fa *param_1)

{
  anon_class_48_3_02cd77fa *param_1_local;
  anon_class_48_3_02cd77fa *this_local;
  
  std::__cxx11::string::string((string *)this,(string *)param_1);
  *(undefined8 *)(this + 0x20) = *(undefined8 *)&param_1->port;
  *(Dispatcher **)(this + 0x28) = param_1->this;
  return;
}

Assistant:

void Dispatcher::Connect(const std::string& ip, uint16_t port) {
    auto task = [ip, port, this]() {
        auto sock = MakeRWSocket();
        sock->SetDispatcher(shared_from_this());
        sock->SetEventActions(_event_actions);
        sock->SetCppNetBase(_cppnet_base.lock());
        sock->Connect(ip, port);
    };

    if (std::this_thread::get_id() == _local_thread_id) {
        task();

    } else {
        PostTask(task);
    }
}